

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void d_pass(D_Parser *ap,D_ParseNode *apn,int pass_number)

{
  D_Pass *pp;
  uint uVar1;
  PNode *pn;
  
  pn = (PNode *)(apn + -2);
  if (apn == (D_ParseNode *)0x0) {
    pn = (PNode *)0x0;
  }
  if (*(int *)&(ap[1].initial_scope)->up <= pass_number) {
    d_fail("bad pass number: %d\n",(ulong)(uint)pass_number);
  }
  pp = (D_Pass *)(&(ap[1].initial_scope)->up_updates->field_0x0 + (long)pass_number * 0x18);
  uVar1 = pp->kind;
  if ((uVar1 & 4) != 0) {
    pass_call((Parser *)ap,pp,pn);
    return;
  }
  if ((uVar1 & 1) != 0) {
    pass_preorder((Parser *)ap,pp,pn);
    return;
  }
  if ((uVar1 & 2) == 0) {
    return;
  }
  pass_postorder((Parser *)ap,pp,pn);
  return;
}

Assistant:

void d_pass(D_Parser *ap, D_ParseNode *apn, int pass_number) {
  PNode *pn = D_ParseNode_to_PNode(apn);
  Parser *p = (Parser *)ap;
  D_Pass *pp;

  if (pass_number >= (int)p->t->npasses) d_fail("bad pass number: %d\n", pass_number);
  pp = &p->t->passes[pass_number];
  if (pp->kind & D_PASS_MANUAL)
    pass_call(p, pp, pn);
  else if (pp->kind & D_PASS_PRE_ORDER)
    pass_preorder(p, pp, pn);
  else if (pp->kind & D_PASS_POST_ORDER)
    pass_postorder(p, pp, pn);
}